

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tnt_object.c
# Opt level: O0

char * tnt_sbuf_object_resize(tnt_stream *s,size_t size)

{
  long *plVar1;
  void *pvVar2;
  char *nd;
  size_t newsize;
  tnt_stream_buf *sb;
  size_t size_local;
  tnt_stream *s_local;
  
  plVar1 = (long *)s->data;
  if ((ulong)plVar1[2] < plVar1[1] + size) {
    nd = (char *)(plVar1[2] << 1);
    if (nd < (char *)(plVar1[1] + size)) {
      nd = (char *)(plVar1[1] + size);
    }
    pvVar2 = tnt_mem_realloc((void *)*plVar1,(size_t)nd);
    if (pvVar2 == (void *)0x0) {
      tnt_mem_free((void *)*plVar1);
      return (char *)0x0;
    }
    *plVar1 = (long)pvVar2;
    plVar1[2] = (long)nd;
  }
  return (char *)(*plVar1 + plVar1[1]);
}

Assistant:

static char *
tnt_sbuf_object_resize(struct tnt_stream *s, size_t size) {
	struct tnt_stream_buf *sb = TNT_SBUF_CAST(s);
	if (sb->size + size > sb->alloc) {
		size_t newsize = 2 * (sb->alloc);
		if (newsize < sb->size + size)
			newsize = sb->size + size;
		char *nd = tnt_mem_realloc(sb->data, newsize);
		if (nd == NULL) {
			tnt_mem_free(sb->data);
			return NULL;
		}
		sb->data = nd;
		sb->alloc = newsize;
	}
	return sb->data + sb->size;
}